

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

backtracer * __thiscall spdlog::details::backtracer::operator=(backtracer *this,backtracer *other)

{
  circular_q<spdlog::details::log_msg_buffer> *in_RSI;
  backtracer *in_RDI;
  lock_guard<std::mutex> lock;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RSI,&in_RDI->mutex_);
  enabled((backtracer *)0x1d3cb0);
  std::atomic<bool>::operator=((atomic<bool> *)in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  circular_q<spdlog::details::log_msg_buffer>::operator=
            (in_RSI,(circular_q<spdlog::details::log_msg_buffer> *)in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d3ced);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE backtracer &backtracer::operator=(backtracer other)
{
    std::lock_guard<std::mutex> lock(mutex_);
    enabled_ = other.enabled();
    messages_ = std::move(other.messages_);
    return *this;
}